

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_queue.cpp
# Opt level: O3

void __thiscall miniros::SubscriptionQueue::clear(SubscriptionQueue *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->callback_mutex_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_mutex_);
  if (iVar1 == 0) {
    std::deque<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
    ::clear(&this->queue_);
    this->queue_size_ = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->callback_mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SubscriptionQueue::clear()
{
  std::scoped_lock<std::recursive_mutex> cb_lock(callback_mutex_);
  std::scoped_lock<std::mutex> queue_lock(queue_mutex_);

  queue_.clear();
  queue_size_ = 0;
}